

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBarrelShape.cpp
# Opt level: O1

void __thiscall
cbtBarrelShape::calculateLocalInertia(cbtBarrelShape *this,cbtScalar mass,cbtVector3 *inertia)

{
  float fVar1;
  float fVar2;
  
  fVar1 = this->R_hor + this->R_offset + 0.04;
  fVar1 = fVar1 + fVar1;
  fVar2 = this->R_vert + 0.04;
  fVar2 = fVar2 + fVar2;
  fVar1 = fVar1 * fVar1;
  fVar2 = mass * 0.08333333 * (fVar2 * fVar2 + fVar1);
  inertia->m_floats[0] = fVar2;
  inertia->m_floats[1] = mass * 0.08333333 * (fVar1 + fVar1);
  inertia->m_floats[2] = fVar2;
  return;
}

Assistant:

void	cbtBarrelShape::calculateLocalInertia(cbtScalar mass,cbtVector3& inertia) const
{
	//***TO DO***
	//as an approximation, take the inertia of the box that bounds the barrell

	cbtTransform ident;
	ident.setIdentity();

	cbtVector3 halfExtents;

	halfExtents.setValue((R_hor+R_offset), 
						 (R_vert),
						 (R_hor+R_offset));

	cbtScalar margin = CONVEX_DISTANCE_MARGIN;

	cbtScalar lx=cbtScalar(2.)*(halfExtents[0]+margin);
	cbtScalar ly=cbtScalar(2.)*(halfExtents[1]+margin);
	cbtScalar lz=cbtScalar(2.)*(halfExtents[2]+margin);
	const cbtScalar x2 = lx*lx;
	const cbtScalar y2 = ly*ly;
	const cbtScalar z2 = lz*lz;
	const cbtScalar scaledmass = mass * cbtScalar(.08333333);

	inertia[0] = scaledmass * (y2+z2);
	inertia[1] = scaledmass * (x2+z2);
	inertia[2] = scaledmass * (x2+y2);
}